

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O0

shared_ptr<jessilib::parser> __thiscall
jessilib::impl::parser_manager::find_parser(parser_manager *this,string *in_format)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<jessilib::parser> sVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_50 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_38;
  iterator itr;
  shared_lock<std::shared_mutex> guard;
  string *in_format_local;
  parser_manager *this_local;
  
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&itr,(mutex_type *)in_format);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
               *)&in_format[3].field_2,in_RDX);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
              *)&in_format[3].field_2);
  bVar1 = std::__detail::operator==(&local_38,local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<jessilib::parser>::shared_ptr
              ((shared_ptr<jessilib::parser> *)this,(nullptr_t)0x0);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_false,_true>
                           *)&local_38);
    std::shared_ptr<jessilib::parser>::shared_ptr
              ((shared_ptr<jessilib::parser> *)this,&ppVar2->second);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&itr);
  sVar3.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<jessilib::parser>)
         sVar3.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<parser> parser_manager::find_parser(const std::string& in_format) {
	std::shared_lock<std::shared_mutex> guard{ m_mutex };

	// Search for the parser by key
	auto itr = m_parsers.find(in_format);
	if (itr != m_parsers.end()) {
		// Found our parser; return
		return itr->second;
	}

	// No parser exists for the given format
	return nullptr;
}